

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall mjs::parser::expect_semicolon_allow_insertion(parser *this,char *func,int line)

{
  token_type tVar1;
  token *__return_storage_ptr__;
  undefined1 auStack_58 [80];
  
  __return_storage_ptr__ = (token *)auStack_58;
  if (((this->line_break_skipped_ == false) &&
      (tVar1 = (this->current_token_).type_, tVar1 != rbrace)) && (tVar1 != eof)) {
    __return_storage_ptr__ = (token *)(auStack_58 + 0x28);
    expect(__return_storage_ptr__,this,semicolon,func,line);
  }
  else {
    accept((parser *)auStack_58,(int)this,(sockaddr *)0x34,(socklen_t *)func);
  }
  token::destroy(__return_storage_ptr__);
  return;
}

Assistant:

void expect_semicolon_allow_insertion(const char* func, int line) {
        //
        // Automatic semi-colon insertion
        //
        if (!line_break_skipped_ && current_token_type() != token_type::rbrace && current_token_type() != token_type::eof) {
            expect(token_type::semicolon, func, line);
        } else {
            accept(token_type::semicolon);
        }
    }